

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86IntelInstPrinter.c
# Opt level: O0

void printopaquemem(MCInst *MI,uint OpNo,SStream *O)

{
  cs_mode cVar1;
  SStream *O_local;
  uint OpNo_local;
  MCInst *MI_local;
  
  SStream_concat0(O,"ptr ");
  cVar1 = MI->csh->mode;
  if (cVar1 == CS_MODE_16) {
    if ((MI->flat_insn->id == 0x9d) || (MI->flat_insn->id == 0x9c)) {
      MI->x86opsize = '\x04';
    }
    else {
      MI->x86opsize = '\x02';
    }
  }
  else if (cVar1 == CS_MODE_32) {
    if ((MI->flat_insn->id == 0x9d) || (MI->flat_insn->id == 0x9c)) {
      MI->x86opsize = '\x06';
    }
    else {
      MI->x86opsize = '\x04';
    }
  }
  else if (cVar1 == CS_MODE_64) {
    if ((MI->flat_insn->id == 0x9d) || (MI->flat_insn->id == 0x9c)) {
      MI->x86opsize = '\n';
    }
    else {
      MI->x86opsize = '\b';
    }
  }
  printMemReference(MI,OpNo,O);
  return;
}

Assistant:

static void printopaquemem(MCInst *MI, unsigned OpNo, SStream *O)
{
	SStream_concat0(O, "ptr ");

	switch(MI->csh->mode) {
		case CS_MODE_16:
			if (MI->flat_insn->id == X86_INS_LJMP || MI->flat_insn->id == X86_INS_LCALL)
				MI->x86opsize = 4;
			else
				MI->x86opsize = 2;
			break;
		case CS_MODE_32:
			if (MI->flat_insn->id == X86_INS_LJMP || MI->flat_insn->id == X86_INS_LCALL)
				MI->x86opsize = 6;
			else
				MI->x86opsize = 4;
			break;
		case CS_MODE_64:
			if (MI->flat_insn->id == X86_INS_LJMP || MI->flat_insn->id == X86_INS_LCALL)
				MI->x86opsize = 10;
			else
				MI->x86opsize = 8;
			break;
		default:	// never reach
			break;
	}

	printMemReference(MI, OpNo, O);
}